

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall t_dart_generator::generate_enum(t_dart_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  ostream *poVar4;
  string *psVar5;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  reference pptVar6;
  string *psVar7;
  int __oflag;
  string local_3f0;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_3d0;
  t_enum_value **local_3c8;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_3c0;
  t_enum_value **local_3b8;
  byte local_3ad;
  int local_3ac;
  bool firstValue;
  iterator iStack_3a8;
  int value;
  t_enum_value **local_3a0;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_398;
  iterator c_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_370;
  string local_350;
  string local_330;
  string local_310 [8];
  string class_name;
  string local_2d0;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  undefined1 local_268 [8];
  ofstream_with_content_based_conditional_update f_enum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string f_enum_name;
  string local_58;
  undefined1 local_38 [8];
  string file_name;
  t_enum *tenum_local;
  t_dart_generator *this_local;
  
  file_name.field_2._8_8_ = tenum;
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&local_58,(string *)CONCAT44(extraout_var,iVar2));
  get_file_name((string *)local_38,this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &f_enum.field_0x198,&this->src_dir_,"/");
  std::operator+(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &f_enum.field_0x198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8,".dart");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&f_enum.field_0x198);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_268);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,pcVar3,&local_289);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_268,(char *)local_288,__oflag);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_2b0);
  poVar4 = std::operator<<((ostream *)local_268,local_2b0);
  std::__cxx11::string::string((string *)(class_name.field_2._M_local_buf + 8),(string *)local_38);
  dart_library(&local_2d0,this,(string *)((long)&class_name.field_2 + 8));
  poVar4 = std::operator<<(poVar4,(string *)&local_2d0);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)(class_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_2b0);
  psVar5 = (string *)(**(code **)(*(long *)file_name.field_2._8_8_ + 0x18))();
  std::__cxx11::string::string(local_310,psVar5);
  std::__cxx11::string::string((string *)&local_330,(string *)local_38);
  std::__cxx11::string::string((string *)&local_350,local_310);
  export_class_to_library(this,&local_330,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  poVar4 = std::operator<<((ostream *)local_268,"class ");
  std::operator<<(poVar4,local_310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_370," ",
             (allocator *)
             ((long)&constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  scope_up(this,(ostream *)local_268,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __x = t_enum::get_constants((t_enum *)file_name.field_2._8_8_);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_398);
  local_3a0 = (t_enum_value **)
              std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                        ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_398._M_current = local_3a0;
  while( true ) {
    iStack_3a8 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                           ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_398,&stack0xfffffffffffffc58);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_398);
    local_3ac = t_enum_value::get_value(*pptVar6);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)local_268);
    poVar4 = std::operator<<(poVar4,"static const int ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_398);
    psVar7 = t_enum_value::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3ac);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_398);
  }
  std::operator<<((ostream *)local_268,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)local_268);
  poVar4 = std::operator<<(poVar4,"static final Set<int> VALID_VALUES = new Set.from([");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  local_3ad = 1;
  local_3b8 = (t_enum_value **)
              std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                        ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_398._M_current = local_3b8;
  while( true ) {
    local_3c0._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_398,&local_3c0);
    if (!bVar1) break;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)local_268);
    pcVar3 = ", ";
    if ((local_3ad & 1) != 0) {
      pcVar3 = "";
    }
    std::operator<<(poVar4,pcVar3);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_398);
    psVar7 = t_enum_value::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<((ostream *)local_268,(string *)psVar7);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    local_3ad = 0;
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_398);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)local_268);
  poVar4 = std::operator<<(poVar4,"]);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)local_268);
  poVar4 = std::operator<<(poVar4,"static final Map<int, String> VALUES_TO_NAMES = {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  local_3ad = 1;
  local_3c8 = (t_enum_value **)
              std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                        ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_398._M_current = local_3c8;
  while( true ) {
    local_3d0._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_398,&local_3d0);
    if (!bVar1) break;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)local_268);
    pcVar3 = ", ";
    if ((local_3ad & 1) != 0) {
      pcVar3 = "";
    }
    std::operator<<(poVar4,pcVar3);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_398);
    psVar7 = t_enum_value::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<((ostream *)local_268,(string *)psVar7);
    poVar4 = std::operator<<(poVar4,": \'");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_398);
    psVar7 = t_enum_value::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4,"\'");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    local_3ad = 0;
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_398);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)local_268);
  poVar4 = std::operator<<(poVar4,"};");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_3f0,(string *)&::endl_abi_cxx11_);
  poVar4 = (ostream *)local_268;
  scope_down(this,poVar4,&local_3f0);
  iVar2 = (int)poVar4;
  std::__cxx11::string::~string((string *)&local_3f0);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_268,iVar2);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  std::__cxx11::string::~string(local_310);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_268);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_dart_generator::generate_enum(t_enum* tenum) {
  // Make output file
  string file_name = get_file_name(tenum->get_name());

  string f_enum_name = src_dir_ + "/" + file_name + ".dart";
  ofstream_with_content_based_conditional_update f_enum;
  f_enum.open(f_enum_name.c_str());

  // Comment and add library
  f_enum << autogen_comment() << dart_library(file_name) << endl;

  string class_name = tenum->get_name();
  export_class_to_library(file_name, class_name);
  f_enum << "class " << class_name;
  scope_up(f_enum);

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    indent(f_enum) << "static const int " << (*c_iter)->get_name() << " = " << value << ";"
                   << endl;
  }

  // Create a static Set with all valid values for this enum
  f_enum << endl;

  indent(f_enum) << "static final Set<int> VALID_VALUES = new Set.from([" << endl;
  indent_up();
  bool firstValue = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // populate set
    indent(f_enum) << (firstValue ? "" : ", ");
    f_enum << (*c_iter)->get_name() << endl;
    firstValue = false;
  }
  indent_down();
  indent(f_enum) << "]);" << endl;

  indent(f_enum) << "static final Map<int, String> VALUES_TO_NAMES = {" << endl;
  indent_up();
  firstValue = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    indent(f_enum) << (firstValue ? "" : ", ");
    f_enum  << (*c_iter)->get_name() << ": '" << (*c_iter)->get_name() << "'" << endl;
    firstValue = false;
  }
  indent_down();
  indent(f_enum) << "};" << endl;

  scope_down(f_enum); // end class

  f_enum.close();
}